

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

int Ssw_RarManObjWhichOne(Ssw_RarMan_t *p,Aig_Obj_t *pObj)

{
  int Id;
  word *pwVar1;
  int local_38;
  int local_34;
  int i;
  int w;
  word Flip;
  word *pSim;
  Aig_Obj_t *pObj_local;
  Ssw_RarMan_t *p_local;
  
  Id = Aig_ObjId(pObj);
  pwVar1 = Ssw_RarObjSim(p,Id);
  local_34 = 0;
  while( true ) {
    if (p->pPars->nWords <= local_34) {
      return -1;
    }
    if (pwVar1[local_34] != 0) break;
    local_34 = local_34 + 1;
  }
  local_38 = 0;
  while ((local_38 < 0x40 && ((pwVar1[local_34] >> ((byte)local_38 & 0x3f) & 1) == 0))) {
    local_38 = local_38 + 1;
  }
  if (local_38 < 0x40) {
    return local_34 * 0x40 + local_38;
  }
  __assert_fail("i < 64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                ,0x244,"int Ssw_RarManObjWhichOne(Ssw_RarMan_t *, Aig_Obj_t *)");
}

Assistant:

int Ssw_RarManObjWhichOne( Ssw_RarMan_t * p, Aig_Obj_t * pObj )
{
    word * pSim = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
    word Flip = 0;//pObj->fPhase ? ~(word)0 : 0; // bug fix!
    int w, i;
    for ( w = 0; w < p->pPars->nWords; w++ )
        if ( pSim[w] ^ Flip )
        {
            for ( i = 0; i < 64; i++ )
                if ( ((pSim[w] ^ Flip) >> i) & 1 )
                    break;
            assert( i < 64 );
            return w * 64 + i;
        }
    return -1;
}